

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdump.cc
# Opt level: O2

int BIO_hexdump(BIO *bio,uint8_t *data,size_t len,uint indent)

{
  uint uVar1;
  uint8_t uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int len_00;
  size_t i;
  ulong uVar6;
  char local_6c;
  char cStack_6b;
  char cStack_6a;
  char cStack_69;
  char cStack_68;
  char local_67;
  char local_66;
  char local_65;
  undefined2 local_64;
  BIO *local_60;
  uint8_t local_58 [16];
  undefined8 local_48;
  ulong uStack_40;
  ulong local_38;
  
  local_48 = 0;
  uStack_40 = 0;
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_38 = (ulong)indent;
  iVar3 = 0;
  uVar6 = 0;
  local_60 = (BIO *)bio;
  do {
    if (len == uVar6) {
LAB_0020eca8:
      uVar1 = local_48._4_4_;
      uVar6 = (ulong)local_48._4_4_;
      if (uVar6 != 0) {
        local_6c = ' ';
        cStack_6b = 0x20;
        cStack_6a = 0x20;
        cStack_69 = 0x20;
        cStack_68 = 0x7c;
        uVar5 = uVar6;
        while( true ) {
          uVar4 = (uint)uVar5;
          if (0xf < uVar4) break;
          iVar3 = (uint)(uVar4 == 0xf) * 2 + 3;
          if (uVar4 == 7) {
            iVar3 = 4;
          }
          iVar3 = BIO_write(local_60,&local_6c,iVar3);
          if (iVar3 < 0) {
            return 0;
          }
          uVar5 = (ulong)(local_48._4_4_ + 1);
          local_48 = CONCAT44(local_48._4_4_ + 1,(undefined4)local_48);
        }
        local_58[uVar6] = '|';
        local_58[uVar1 + 1] = '\n';
        iVar3 = BIO_write(local_60,local_58,uVar1 + 2);
        if (iVar3 < 0) {
          return 0;
        }
      }
      return 1;
    }
    if (iVar3 == 0) {
      BIO_indent(local_60,(int)local_38,-1);
      local_6c = "0123456789abcdef"[uStack_40 >> 0x1c & 0xf];
      cStack_6b = "0123456789abcdef"[(uint)(uStack_40 >> 0x18) & 0xf];
      cStack_6a = "0123456789abcdef"[(uint)(uStack_40 >> 0x14) & 0xf];
      cStack_69 = "0123456789abcdef"[(uint)(uStack_40 >> 0x10) & 0xf];
      cStack_68 = "0123456789abcdef"[(uint)(uStack_40 >> 0xc) & 0xf];
      local_67 = "0123456789abcdef"[(uint)(uStack_40 >> 8) & 0xf];
      local_66 = "0123456789abcdef"[(uint)(uStack_40 >> 4) & 0xf];
      local_65 = "0123456789abcdef"[(uint)uStack_40 & 0xf];
      local_64 = 0x2020;
      iVar3 = BIO_write(local_60,&local_6c,10);
      if (-1 < iVar3) {
        iVar3 = local_48._4_4_;
        goto LAB_0020ebf8;
      }
LAB_0020eca1:
      if (uVar6 < len) {
        return 0;
      }
      goto LAB_0020eca8;
    }
LAB_0020ebf8:
    local_6c = "0123456789abcdef"[data[uVar6] >> 4];
    cStack_6b = "0123456789abcdef"[data[uVar6] & 0xf];
    cStack_6a = 0x20;
    if (iVar3 == 0xf) {
      cStack_68 = '|';
      len_00 = 5;
LAB_0020ec39:
      cStack_69 = ' ';
    }
    else {
      len_00 = 3;
      if (iVar3 == 7) {
        len_00 = 4;
        goto LAB_0020ec39;
      }
    }
    iVar3 = BIO_write(local_60,&local_6c,len_00);
    if (iVar3 < 0) goto LAB_0020eca1;
    uVar2 = data[uVar6];
    if ((byte)(uVar2 + 0x81) < 0xa1) {
      uVar2 = '.';
    }
    local_58[local_48 >> 0x20] = uVar2;
    iVar3 = local_48._4_4_ + 1;
    local_48 = CONCAT44(iVar3,(undefined4)local_48);
    uStack_40 = uStack_40 + 1;
    if (iVar3 == 0x10) {
      local_48 = CONCAT62(local_48._2_6_,0xa7c);
      iVar3 = BIO_write(local_60,local_58,0x12);
      if (iVar3 < 0) goto LAB_0020eca1;
      local_48 = local_48 & 0xffffffff;
      iVar3 = 0;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

int BIO_hexdump(BIO *bio, const uint8_t *data, size_t len, unsigned indent) {
  struct hexdump_ctx ctx;
  OPENSSL_memset(&ctx, 0, sizeof(ctx));
  ctx.bio = bio;
  ctx.indent = indent;

  if (!hexdump_write(&ctx, data, len) || !finish(&ctx)) {
    return 0;
  }

  return 1;
}